

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

ostream * __thiscall smf::Option_register::print(Option_register *this,ostream *out)

{
  ostream *poVar1;
  char local_19;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"definition:\t",0xc);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->m_definition)._M_dataplus._M_p,
                      (this->m_definition)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"description:\t",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->m_description)._M_dataplus._M_p,
                      (this->m_description)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"defaultOption:\t",0xf);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->m_defaultOption)._M_dataplus._M_p,
                      (this->m_defaultOption)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"modifiedOption:\t",0x10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->m_modifiedOption)._M_dataplus._M_p,
                      (this->m_modifiedOption)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"modifiedQ:\t\t",0xc);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(out,0));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"type:\t\t",7);
  local_19 = this->m_type;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_19,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return out;
}

Assistant:

std::ostream& Option_register::print(std::ostream& out) {
	out << "definition:\t"     << m_definition     << std::endl;
	out << "description:\t"    << m_description    << std::endl;
	out << "defaultOption:\t"  << m_defaultOption  << std::endl;
	out << "modifiedOption:\t" << m_modifiedOption << std::endl;
	out << "modifiedQ:\t\t"    << m_modifiedQ      << std::endl;
	out << "type:\t\t"         << m_type           << std::endl;
	return out;
}